

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  anon_class_24_3_e601bc94 f;
  bool bVar3;
  uint64_t uVar4;
  ulong uVar5;
  size_t sVar6;
  undefined8 uVar7;
  uint64_t v;
  size_t sVar8;
  ctrl_t cVar9;
  ulong uVar10;
  FindInfo FVar11;
  HashSetResizeHelper resize_helper;
  undefined1 local_8a;
  undefined1 local_89;
  HeapOrSoo local_88;
  size_t local_78;
  byte local_70;
  undefined2 local_6f;
  void *local_60;
  MaybeInitializedPtr local_58;
  void *local_50;
  CommonFields *local_48;
  void **ppvStack_40;
  MaybeInitializedPtr *local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_78 = common->capacity_;
    local_70 = (byte)common->size_ & 1;
    local_6f = 0;
    local_88.heap.control = (common->heap_or_soo_).heap.control;
    local_88.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_88,common,&local_89,0xffffff80,0x20,0x20);
    if (local_78 != 0) {
      if (bVar3) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,void>,std::allocator<std::__cxx11::string>>
                  ((HashSetResizeHelper *)&local_88.heap,common,
                   (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)common);
      }
      else {
        if ((char)local_6f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        local_60 = (common->heap_or_soo_).heap.slot_array.p;
        sVar8 = 0;
        sVar6 = local_78;
        uVar7 = local_88.heap.slot_array;
        do {
          if ((char)local_6f == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_88.heap.control[sVar8]) {
            uVar1 = *(ulong *)(uVar7 + 8);
            uVar4 = hash_internal::MixingHashState::CombineContiguousImpl
                              (&hash_internal::MixingHashState::kSeed,*(undefined8 *)uVar7,uVar1);
            uVar10 = (uVar4 ^ uVar1) * -0x234dd359734ecb13;
            FVar11 = find_first_non_full<void>
                               (common,uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                                       (uVar10 & 0xff0000000000) >> 0x18 |
                                       (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 |
                                       (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
                                       uVar10 << 0x38);
            uVar5 = FVar11.offset;
            uVar1 = common->capacity_;
            if (uVar1 <= uVar5) {
              __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x744,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar9 = (ctrl_t)(uVar10 >> 0x38) & ~kEmpty;
            pcVar2 = (common->heap_or_soo_).heap.control;
            pcVar2[uVar5] = cVar9;
            pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar5 - 0xf & uVar1)] = cVar9;
            local_50 = (void *)(uVar5 * 0x20 + (long)local_60);
            ppvStack_40 = &local_50;
            f.to = (slot_type **)ppvStack_40;
            f.this = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)common;
            f.from = (slot_type **)&local_58;
            local_58 = (MaybeInitializedPtr)uVar7;
            local_48 = common;
            local_38 = &local_58;
            CommonFields::
            RunWithReentrancyGuard<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>::transfer(std::__cxx11::string*,std::__cxx11::string*)::_lambda()_1_>
                      (common,f);
            sVar6 = local_78;
          }
          sVar8 = sVar8 + 1;
          uVar7 = uVar7 + 0x20;
        } while (sVar8 != sVar6);
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_88,&local_8a,0x20);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }